

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O0

void __thiscall
vm_test_interpret_instr_extended_Test::~vm_test_interpret_instr_extended_Test
          (vm_test_interpret_instr_extended_Test *this)

{
  vm_test_interpret_instr_extended_Test *this_local;
  
  ~vm_test_interpret_instr_extended_Test(this);
  operator_delete(this,0x188);
  return;
}

Assistant:

TEST_F(vm_test, interpret_instr_extended) {

  // test language with an extra concept

  // push on unsigned stack
  EXPECT_EQ(vm2.interpret(prog_chunk({0x0})), status_type::SUCCESS);

  // push on double stack
  EXPECT_EQ(vm2.interpret(prog_chunk({0x1})), status_type::SUCCESS);

  // push ui32, push double, then add
  EXPECT_EQ(vm2.interpret(prog_chunk({0x2, 0x3, 0x4})), status_type::SUCCESS);
}